

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrUtil.c
# Opt level: O1

void Rwr_ManLoadFromFile(Rwr_Man_t *p,char *pFileName)

{
  uint uVar1;
  uint uVar2;
  void **ppvVar3;
  Rwr_Node_t *p0;
  Rwr_Node_t *p1;
  int iVar4;
  uint uVar5;
  FILE *__stream;
  void *__ptr;
  long lVar6;
  ulong uVar7;
  int level;
  ulong uVar8;
  uint uVar9;
  timespec ts;
  int nEntries;
  timespec local_60;
  long local_50;
  ulong local_48;
  ulong local_40;
  int local_34;
  
  iVar4 = clock_gettime(3,&local_60);
  if (iVar4 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_60.tv_sec * -1000000;
  }
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Rwr_ManLoadFromFile: Cannot open file \"%s\".\n",pFileName);
  }
  else {
    local_50 = lVar6;
    fread(&local_34,4,1,__stream);
    uVar8 = (ulong)local_34;
    __ptr = malloc(uVar8 * 8);
    fread(__ptr,4,uVar8 * 2,__stream);
    fclose(__stream);
    if (0 < (long)uVar8) {
      uVar7 = 0;
      local_48 = uVar8;
      do {
        uVar1 = *(uint *)((long)__ptr + uVar7 * 8);
        uVar2 = *(uint *)((long)__ptr + uVar7 * 8 + 4);
        local_40 = (ulong)(uVar1 & 1);
        *(uint *)((long)__ptr + uVar7 * 8) = uVar1 >> 1;
        ppvVar3 = p->vForest->pArray;
        p0 = (Rwr_Node_t *)ppvVar3[uVar1 >> 2];
        p1 = (Rwr_Node_t *)ppvVar3[uVar2 >> 1];
        uVar5 = (byte)p0->field_0x11 & 0x3f;
        uVar9 = (byte)p1->field_0x11 & 0x3f;
        if (uVar9 < uVar5) {
          uVar9 = uVar5;
        }
        iVar4 = Rwr_ManNodeVolume(p,p0,p1);
        uVar8 = local_48;
        Rwr_ManAddNode(p,(Rwr_Node_t *)((ulong)(uVar1 >> 1 & 1) ^ (ulong)p0),
                       (Rwr_Node_t *)((ulong)(uVar2 & 1) ^ (ulong)p1),(int)local_40,uVar9 + 1,
                       (int)local_40 + iVar4 + 1);
        uVar7 = uVar7 + 1;
      } while (uVar8 != uVar7);
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    printf("The number of classes = %d. Canonical nodes = %d.\n",(ulong)(uint)p->nClasses,
           (ulong)(uint)p->nAdded);
    iVar4 = 0x877073;
    printf("The number of nodes loaded = %d.   ",uVar8 & 0xffffffff);
    Abc_Print(iVar4,"%s =","Loading");
    level = 3;
    iVar4 = clock_gettime(3,&local_60);
    if (iVar4 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    Abc_Print(level,"%9.2f sec\n",(double)(lVar6 + local_50) / 1000000.0);
  }
  return;
}

Assistant:

void Rwr_ManLoadFromFile( Rwr_Man_t * p, char * pFileName )
{
    FILE * pFile;
    Rwr_Node_t * p0, * p1;
    unsigned * pBuffer;
    int Level, Volume, nEntries, fExor;
    int i;
    abctime clk = Abc_Clock();
    int RetValue;

    // load the data
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Rwr_ManLoadFromFile: Cannot open file \"%s\".\n", pFileName );
        return;
    }
    RetValue = fread( &nEntries, sizeof(int), 1, pFile );
    pBuffer = ABC_ALLOC( unsigned, nEntries * 2 );
    RetValue = fread( pBuffer, sizeof(unsigned), nEntries * 2, pFile );
    fclose( pFile );
    // reconstruct the forest
    for ( i = 0; i < nEntries; i++ )
    {
        // get EXOR flag
        fExor = (pBuffer[2*i + 0] & 1);
        pBuffer[2*i + 0] = (pBuffer[2*i + 0] >> 1);
        // get the nodes
        p0 = (Rwr_Node_t *)p->vForest->pArray[pBuffer[2*i + 0] >> 1];
        p1 = (Rwr_Node_t *)p->vForest->pArray[pBuffer[2*i + 1] >> 1];
        // compute the level and volume of the new nodes
        Level  = 1 + Abc_MaxInt( p0->Level, p1->Level );
        Volume = 1 + Rwr_ManNodeVolume( p, p0, p1 );
        // set the complemented attributes
        p0 = Rwr_NotCond( p0, (pBuffer[2*i + 0] & 1) );
        p1 = Rwr_NotCond( p1, (pBuffer[2*i + 1] & 1) );
        // add the node
//        Rwr_ManTryNode( p, p0, p1, Level, Volume );
        Rwr_ManAddNode( p, p0, p1, fExor, Level, Volume + fExor );
    }
    ABC_FREE( pBuffer );
    printf( "The number of classes = %d. Canonical nodes = %d.\n", p->nClasses, p->nAdded );
    printf( "The number of nodes loaded = %d.   ", nEntries );  ABC_PRT( "Loading", Abc_Clock() - clk );
}